

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

Triple * __thiscall
llvm::Triple::getBigEndianArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  bool bVar1;
  ArchType AVar2;
  Triple *this_local;
  Triple *T;
  
  Triple(__return_storage_ptr__,this);
  bVar1 = isLittleEndian(this);
  if (bVar1) {
    AVar2 = getArch(this);
    switch(AVar2) {
    case UnknownArch:
    case arm:
    case avr:
    case hexagon:
    case msp430:
    case nios2:
    case r600:
    case amdgcn:
    case riscv32:
    case riscv64:
    case thumb:
    case x86:
    case x86_64:
    case xcore:
    case nvptx:
    case nvptx64:
    case le32:
    case le64:
    case amdil:
    case amdil64:
    case hsail:
    case hsail64:
    case spir:
    case spir64:
    case kalimba:
    case shave:
    case wasm32:
    case wasm64:
    case renderscript32:
    case LastArchType:
      setArch(__return_storage_ptr__,UnknownArch);
      break;
    default:
      llvm_unreachable_internal
                ("getBigEndianArchVariant: unknown triple.",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                 ,0x59b);
    case aarch64:
      setArch(__return_storage_ptr__,aarch64_be);
      break;
    case bpfel:
      setArch(__return_storage_ptr__,bpfeb);
      break;
    case mipsel:
      setArch(__return_storage_ptr__,mips);
      break;
    case mips64el:
      setArch(__return_storage_ptr__,mips64);
      break;
    case ppc64le:
      setArch(__return_storage_ptr__,ppc64);
      break;
    case sparcel:
      setArch(__return_storage_ptr__,sparc);
      break;
    case tcele:
      setArch(__return_storage_ptr__,tce);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::getBigEndianArchVariant() const {
  Triple T(*this);
  // Already big endian.
  if (!isLittleEndian())
    return T;
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::amdgcn:
  case Triple::amdil64:
  case Triple::amdil:
  case Triple::avr:
  case Triple::hexagon:
  case Triple::hsail64:
  case Triple::hsail:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::le64:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::nvptx64:
  case Triple::nvptx:
  case Triple::r600:
  case Triple::riscv32:
  case Triple::riscv64:
  case Triple::shave:
  case Triple::spir64:
  case Triple::spir:
  case Triple::wasm32:
  case Triple::wasm64:
  case Triple::x86:
  case Triple::x86_64:
  case Triple::xcore:
  case Triple::renderscript32:
  case Triple::renderscript64:

  // ARM is intentionally unsupported here, changing the architecture would
  // drop any arch suffixes.
  case Triple::arm:
  case Triple::thumb:
    T.setArch(UnknownArch);
    break;

  case Triple::tcele:   T.setArch(Triple::tce);        break;
  case Triple::aarch64: T.setArch(Triple::aarch64_be); break;
  case Triple::bpfel:   T.setArch(Triple::bpfeb);      break;
  case Triple::mips64el:T.setArch(Triple::mips64);     break;
  case Triple::mipsel:  T.setArch(Triple::mips);       break;
  case Triple::ppc64le: T.setArch(Triple::ppc64);      break;
  case Triple::sparcel: T.setArch(Triple::sparc);      break;
  default:
    llvm_unreachable("getBigEndianArchVariant: unknown triple.");
  }
  return T;
}